

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O1

void __thiscall irr::scene::CMeshCache::addMesh(CMeshCache *this,path *filename,IAnimatedMesh *mesh)

{
  int *piVar1;
  MeshEntry e;
  value_type local_60;
  
  piVar1 = (int *)(&(mesh->super_IMesh).field_0x10 + (long)(mesh->super_IMesh)._vptr_IMesh[-3]);
  *piVar1 = *piVar1 + 1;
  irr::io::SNamedPath::SNamedPath(&local_60.NamedPath,filename);
  local_60.Mesh = mesh;
  std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
  ::push_back((vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
               *)&(this->super_IMeshCache).field_0x8,&local_60);
  this->field_0x20 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.NamedPath.InternalName.str._M_dataplus._M_p !=
      &local_60.NamedPath.InternalName.str.field_2) {
    operator_delete(local_60.NamedPath.InternalName.str._M_dataplus._M_p,
                    local_60.NamedPath.InternalName.str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.NamedPath.Path.str._M_dataplus._M_p != &local_60.NamedPath.Path.str.field_2) {
    operator_delete(local_60.NamedPath.Path.str._M_dataplus._M_p,
                    local_60.NamedPath.Path.str.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CMeshCache::addMesh(const io::path &filename, IAnimatedMesh *mesh)
{
	mesh->grab();

	MeshEntry e(filename);
	e.Mesh = mesh;

	Meshes.push_back(e);
}